

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ObjMergeOrder(Lf_Man_t *p,int iObj)

{
  float FlowRefs;
  float fVar1;
  byte bVar2;
  byte bVar3;
  uint nCutNum_00;
  Lf_Plc_t LVar4;
  uint uVar5;
  int *piVar6;
  Jf_Par_t *pJVar7;
  Gia_Man_t *pGVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint *puVar11;
  Gia_Obj_t *pGVar12;
  word *pwVar13;
  Lf_Cut_t *pLVar14;
  Lf_Cut_t *pLVar15;
  Vec_Mem_t *pVVar16;
  Lf_Cut_t *pLVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  Lf_Cut_t *pLVar22;
  Lf_Cut_t *pLVar23;
  Lf_Cut_t *pLVar24;
  ulong uVar25;
  byte bVar26;
  int iVar27;
  uint uVar28;
  uint fCompl1;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  uint uVar36;
  uint uVar37;
  Gia_Obj_t *pMux;
  Lf_Bst_t *pLVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  long lVar45;
  word *pwVar46;
  int nCutNum;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  Lf_Cut_t *pLVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  int local_17e4;
  uint local_17d8;
  int local_17d4;
  uint local_17d0;
  Lf_Cut_t *local_17b8;
  Lf_Cut_t *local_1768;
  Lf_Cut_t *local_1760;
  Lf_Cut_t *pCutsR [32];
  word uTruth [128];
  word local_1238 [128];
  word uTruth0 [128];
  word CutSet [32] [10];
  
  pLVar22 = (Lf_Cut_t *)CutSet;
  memset(pLVar22,0,0xa00);
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
LAB_0072a21a:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  iVar48 = (p->vOffsets).nSize;
  if (iObj < iVar48) {
    piVar6 = (p->vOffsets).pArray;
    iVar27 = piVar6[(uint)iObj];
    lVar30 = (long)iVar27;
    if ((lVar30 < 0) || ((p->vFlowRefs).nSize <= iVar27)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecFlt.h"
                    ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
    }
    if ((p->vRequired).nSize <= iObj) goto LAB_0072a103;
    pMux = p->pGia->pObjs + (uint)iObj;
    pJVar7 = p->pPars;
    uVar5 = pJVar7->nLutSize / 2;
    if (pJVar7->fCutGroup == 0) {
      uVar5 = pJVar7->nLutSize;
    }
    uVar25 = *(ulong *)pMux;
    uVar34 = iObj - ((uint)uVar25 & 0x1fffffff);
    if (((int)uVar34 < 0) || (iVar48 <= (int)uVar34)) goto LAB_0072a103;
    FlowRefs = (p->vFlowRefs).pArray[lVar30];
    local_17d4 = (p->vRequired).pArray[(uint)iObj];
    nCutNum_00 = pJVar7->nCutNum;
    lVar35 = (long)p->nCutWords;
    pLVar38 = p->pObjBests + lVar30;
    if (piVar6[uVar34] == -1) {
      Lf_ManPrepareSet_CutTemp._16_4_ = 2;
      Lf_ManPrepareSet_CutTemp._20_4_ = Lf_ManPrepareSet_CutTemp._20_4_ & 0x3fffff | 0x1000000;
      Lf_ManPrepareSet_CutTemp._0_8_ = 1L << ((byte)uVar34 & 0x3f);
      local_17b8 = (Lf_Cut_t *)Lf_ManPrepareSet_CutTemp;
      local_17d8 = 1;
      Lf_ManPrepareSet_CutTemp._24_4_ = uVar34;
    }
    else {
      local_17b8 = Lf_ManFetchSet(p,uVar34);
      if ((int)nCutNum_00 < 1) {
        local_17d8 = 0;
      }
      else {
        local_17d8 = 0;
        pLVar23 = local_17b8;
        uVar34 = local_17d8;
        do {
          local_17d8 = uVar34;
          if (0xfeffffff < *(uint *)&pLVar23->field_0x14) break;
          pLVar23 = (Lf_Cut_t *)(&pLVar23->Sign + p->nCutWords);
          uVar34 = local_17d8 + 1;
          local_17d8 = nCutNum_00;
        } while (nCutNum_00 != uVar34);
      }
    }
    uVar34 = iObj - (*(uint *)&pMux->field_0x4 & 0x1fffffff);
    if (((int)uVar34 < 0) || ((p->vOffsets).nSize <= (int)uVar34)) goto LAB_0072a103;
    if ((p->vOffsets).pArray[uVar34] == -1) {
      Lf_ManPrepareSet_CutTemp._96_4_ = 2;
      Lf_ManPrepareSet_CutTemp._100_4_ = Lf_ManPrepareSet_CutTemp._100_4_ & 0x3fffff | 0x1000000;
      Lf_ManPrepareSet_CutTemp._80_8_ = 1L << ((byte)uVar34 & 0x3f);
      local_17e4 = 1;
      local_1768 = (Lf_Cut_t *)(Lf_ManPrepareSet_CutTemp + 0x50);
      Lf_ManPrepareSet_CutTemp._104_4_ = uVar34;
    }
    else {
      iVar48 = p->pPars->nCutNum;
      local_1768 = Lf_ManFetchSet(p,uVar34);
      if (iVar48 < 1) {
        local_17e4 = 0;
      }
      else {
        local_17e4 = 0;
        pLVar23 = local_1768;
        iVar27 = local_17e4;
        do {
          local_17e4 = iVar27;
          if (0xfeffffff < *(uint *)&pLVar23->field_0x14) break;
          pLVar23 = (Lf_Cut_t *)(&pLVar23->Sign + p->nCutWords);
          iVar27 = local_17e4 + 1;
          local_17e4 = iVar48;
        } while (iVar48 != iVar27);
      }
    }
    piVar6 = p->pGia->pSibls;
    if (piVar6 == (int *)0x0) {
      uVar34 = 0;
    }
    else {
      uVar34 = piVar6[(uint)iObj];
    }
    uVar28 = (uint)*(undefined8 *)pMux;
    if (((-1 < (int)uVar28) && (uVar28 = uVar28 & 0x1fffffff, uVar28 != 0x1fffffff)) &&
       (uVar28 == ((uint)((ulong)*(undefined8 *)pMux >> 0x20) & 0x1fffffff))) {
      __assert_fail("!Gia_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                    ,0x4b5,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
    }
    if (0 < (int)nCutNum_00) {
      uVar31 = 0;
      do {
        pCutsR[uVar31] = pLVar22;
        uVar31 = uVar31 + 1;
        pLVar22 = (Lf_Cut_t *)(&pLVar22->Sign + lVar35);
      } while (nCutNum_00 != uVar31);
    }
    pLVar22 = pCutsR[0];
    if (p->Iter == 0) {
      uVar28 = 0;
    }
    else {
      Lf_MemLoadCut(&p->vStoreOld,(uint)pLVar38->Cut[0] >> 1,iObj,pCutsR[0],p->pPars->fCutMin,1);
      if (1 < ((uint)pLVar38->Cut[0] ^ (uint)pLVar38->Cut[1])) {
        Lf_MemLoadCut(&p->vStoreOld,(uint)pLVar38->Cut[1] >> 1,iObj,pCutsR[1],p->pPars->fCutMin,1);
      }
      if (p->fUseEla != 0) {
        if ((p->vOffsets).nSize <= iObj) goto LAB_0072a103;
        iVar48 = (p->vOffsets).pArray[(uint)iObj];
        if (((long)iVar48 < 0) || ((p->vMapRefs).nSize <= iVar48)) goto LAB_0072a103;
        if (0 < (p->vMapRefs).pArray[iVar48]) {
          Lf_CutDeref_rec(p,pCutsR[(uint)pLVar38->Cut[1] & 1]);
        }
      }
      if (local_17d4 == 1000000000) {
        if (*(uint *)&pLVar22->field_0x14 < 0x1000000) {
          iVar48 = 2;
          local_17d4 = 1;
        }
        else {
          uVar31 = 0;
          iVar48 = 0;
          local_17d4 = 0;
          do {
            iVar27 = *(int *)((long)&pLVar22[1].Sign + uVar31 * 4);
            lVar30 = (long)iVar27;
            if ((lVar30 < 0) || ((p->vOffsets).nSize <= iVar27)) goto LAB_0072a103;
            lVar45 = (long)(p->vOffsets).pArray[lVar30];
            if (lVar45 < 0) {
              if (p->pGia->nObjs <= iVar27) goto LAB_0072a21a;
              iVar27 = Lf_ObjArrival_rec(p,p->pGia->pObjs + lVar30);
            }
            else {
              iVar27 = p->pObjBests[lVar45].Delay[0];
            }
            if (local_17d4 <= iVar27) {
              local_17d4 = iVar27;
            }
            iVar27 = *(int *)((long)&pLVar22[1].Sign + uVar31 * 4);
            if (((long)iVar27 < 0) || ((p->vRequired).nSize <= iVar27)) goto LAB_0072a103;
            iVar27 = (p->vRequired).pArray[iVar27];
            iVar47 = iVar27;
            if (iVar27 < iVar48) {
              iVar47 = iVar48;
            }
            if (iVar27 < 1000000000) {
              iVar48 = iVar47;
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 < (byte)pLVar22->field_0x17);
          iVar48 = iVar48 + 2;
          local_17d4 = local_17d4 + 1;
        }
        if (local_17d4 < iVar48) {
          local_17d4 = iVar48;
        }
      }
      Lf_CutParams(p,pLVar22,local_17d4,FlowRefs,pMux);
      uVar28 = 1;
      if (1 < ((uint)pLVar38->Cut[1] ^ (uint)pLVar38->Cut[0])) {
        Lf_CutParams(p,pCutsR[1],local_17d4,FlowRefs,pMux);
        uVar28 = Lf_SetAddCut(pCutsR,1,nCutNum_00);
      }
      if ((pCutsR[0]->field_0x16 & 0x40) != 0) {
        p->nTimeFails = p->nTimeFails + 1;
      }
    }
    if (uVar34 != 0) {
      pGVar8 = p->pGia;
      iVar48 = pGVar8->pSibls[(uint)iObj];
      if (((long)iVar48 < 0) || (pGVar8->nObjs <= iVar48)) goto LAB_0072a21a;
      if (((int)uVar34 < 0) || ((p->vOffsets).nSize <= (int)uVar34)) goto LAB_0072a103;
      uVar9 = *(undefined8 *)(pGVar8->pObjs + iVar48);
      uVar10 = *(undefined8 *)pMux;
      if ((p->vOffsets).pArray[uVar34] == -1) {
        Lf_ManPrepareSet_CutTemp._176_4_ = 2;
        Lf_ManPrepareSet_CutTemp._180_4_ = Lf_ManPrepareSet_CutTemp._180_4_ & 0x3fffff | 0x1000000;
        Lf_ManPrepareSet_CutTemp._160_8_ = 1L << ((byte)uVar34 & 0x3f);
        pLVar22 = (Lf_Cut_t *)(Lf_ManPrepareSet_CutTemp + 0xa0);
        iVar48 = 1;
        Lf_ManPrepareSet_CutTemp._184_4_ = uVar34;
      }
      else {
        iVar27 = p->pPars->nCutNum;
        pLVar22 = Lf_ManFetchSet(p,uVar34);
        iVar47 = 0;
        pLVar23 = pLVar22;
        iVar48 = 0;
        if (0 < iVar27) {
          do {
            iVar48 = iVar47;
            if (0xfeffffff < *(uint *)&pLVar23->field_0x14) break;
            iVar47 = iVar47 + 1;
            pLVar23 = (Lf_Cut_t *)(&pLVar23->Sign + p->nCutWords);
            iVar48 = iVar27;
          } while (iVar27 != iVar47);
        }
      }
      if (0 < iVar48) {
        do {
          if ((uint)pLVar22[1].Sign != uVar34) {
            pLVar23 = pCutsR[(int)uVar28];
            memcpy(pLVar23,pLVar22,lVar35 * 8);
            if (-1 < pLVar23->iFunc) {
              local_17d0 = ((uint)((ulong)uVar9 >> 0x20) ^ (uint)((ulong)uVar10 >> 0x20)) >> 0x1f;
              pLVar23->iFunc = pLVar23->iFunc ^ local_17d0;
            }
            Lf_CutParams(p,pLVar23,local_17d4,FlowRefs,pMux);
            uVar28 = Lf_SetAddCut(pCutsR,uVar28,nCutNum_00);
          }
          pLVar22 = (Lf_Cut_t *)(&pLVar22->Sign + lVar35);
          iVar48 = iVar48 + -1;
        } while (iVar48 != 0);
      }
    }
    uVar34 = (uint)(uVar25 >> 0x1d) & 1;
    fCompl1 = (uint)(uVar25 >> 0x3d) & 1;
    pGVar8 = p->pGia;
    puVar11 = pGVar8->pMuxes;
    if ((puVar11 == (uint *)0x0) || (puVar11[(uint)iObj] == 0)) {
      uVar29 = (uint)*(undefined8 *)pMux;
      bVar55 = (~uVar29 & 0x1fffffff) != 0;
      bVar53 = (uVar29 & 0x1fffffff) < ((uint)((ulong)*(undefined8 *)pMux >> 0x20) & 0x1fffffff);
      p->CutCount[0] = (double)(int)(local_17e4 * local_17d8) + p->CutCount[0];
      if (0 < (int)local_17d8) {
        iVar48 = 1 << ((char)uVar5 - 6U & 0x1f);
        if ((int)uVar5 < 7) {
          iVar48 = 1;
        }
        uVar18 = 0;
        do {
          if (((int)(uint)(byte)local_17b8->field_0x17 <= (int)uVar5) && (0 < local_17e4)) {
            iVar27 = 0;
            pLVar22 = local_1768;
            do {
              uVar21 = *(uint *)&pLVar22->field_0x14 >> 0x18;
              if (((int)uVar21 <= (int)uVar5) &&
                 (((int)((byte)local_17b8->field_0x17 + uVar21) <= (int)uVar5 ||
                  (uVar25 = pLVar22->Sign | local_17b8->Sign,
                  uVar25 = uVar25 - (uVar25 >> 1 & 0x5555555555555555),
                  uVar25 = (uVar25 >> 2 & 0x3333333333333333) + (uVar25 & 0x3333333333333333),
                  (int)(uint)(byte)(((uVar25 >> 4) + uVar25 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38) <= (int)uVar5)))) {
                p->CutCount[1] = p->CutCount[1] + 1.0;
                pLVar24 = pCutsR[(int)uVar28];
                uVar21 = *(uint *)&local_17b8->field_0x14;
                uVar39 = uVar21 >> 0x18;
                uVar42 = *(uint *)&pLVar22->field_0x14 >> 0x18;
                pLVar23 = pLVar24 + 1;
                if ((uVar39 == uVar5) && (uVar42 == uVar5)) {
                  if (0xffffff < uVar21) {
                    uVar25 = 0;
                    do {
                      iVar47 = *(int *)((long)&local_17b8[1].Sign + uVar25 * 4);
                      if (iVar47 != *(int *)((long)&pLVar22[1].Sign + uVar25 * 4))
                      goto LAB_00729195;
                      *(int *)((long)&pLVar23->Sign + uVar25 * 4) = iVar47;
                      uVar25 = uVar25 + 1;
                    } while (uVar39 != uVar25);
                  }
                  *(uint *)&pLVar24->field_0x14 =
                       *(uint *)&pLVar24->field_0x14 & 0xffffff | uVar5 << 0x18;
                  pLVar24->iFunc = -1;
LAB_007287fe:
                  pLVar24->Sign = pLVar22->Sign | local_17b8->Sign;
                  if (0 < (int)uVar28) {
                    pLVar52 = pCutsR[uVar28];
                    uVar21 = *(uint *)&pLVar52->field_0x14 >> 0x18;
                    uVar25 = 0;
                    do {
                      pLVar17 = pCutsR[uVar25];
                      uVar39 = *(uint *)&pLVar17->field_0x14 >> 0x18;
                      if ((uVar39 <= uVar21) && ((pLVar17->Sign & ~pLVar52->Sign) == 0)) {
                        if (uVar21 == uVar39) {
                          if (*(uint *)&pLVar52->field_0x14 < 0x1000000) goto LAB_00729195;
                          uVar31 = 0;
                          while (*(int *)((long)&pLVar52[1].Sign + uVar31 * 4) ==
                                 *(int *)((long)&pLVar17[1].Sign + uVar31 * 4)) {
                            uVar31 = uVar31 + 1;
                            if (uVar21 == uVar31) goto LAB_00729195;
                          }
                        }
                        else {
                          if (uVar21 <= uVar39) goto LAB_0072a049;
                          if (*(uint *)&pLVar17->field_0x14 < 0x1000000) goto LAB_00729195;
                          uVar31 = 0;
                          uVar42 = 0;
                          do {
                            iVar47 = *(int *)((long)&pLVar17[1].Sign + (long)(int)uVar42 * 4);
                            iVar19 = *(int *)((long)&pLVar52[1].Sign + uVar31 * 4);
                            if (iVar47 < iVar19) break;
                            if ((iVar19 == iVar47) && (uVar42 = uVar42 + 1, uVar42 == uVar39))
                            goto LAB_00729195;
                            uVar31 = uVar31 + 1;
                          } while (uVar21 != uVar31);
                        }
                      }
                      uVar25 = uVar25 + 1;
                    } while (uVar25 != uVar28);
                  }
                  p->CutCount[2] = p->CutCount[2] + 1.0;
                  pJVar7 = p->pPars;
                  if (pJVar7->fCutMin != 0) {
                    if (pJVar7->nLutSize < 7) {
                      uVar21 = local_17b8->iFunc;
                      if ((int)uVar21 < 0) goto LAB_0072a0a6;
                      pVVar16 = p->vTtMem;
                      uVar39 = uVar21 >> 1;
                      if (pVVar16->nEntries <= (int)uVar39) goto LAB_0072a0c5;
                      bVar26 = (byte)pVVar16->LogPageSze;
                      uVar42 = pLVar22->iFunc;
                      if ((int)uVar42 < 0) goto LAB_0072a0a6;
                      uVar44 = uVar42 >> 1;
                      if (pVVar16->nEntries <= (int)uVar44) goto LAB_0072a0c5;
                      uVar37 = *(uint *)&pLVar24->field_0x14;
                      uVar36 = uVar37 >> 0x18;
                      uVar25 = (ulong)uVar36;
                      uVar31 = -(ulong)((uVar21 & 1) != uVar34) ^
                               pVVar16->ppPages[uVar39 >> (bVar26 & 0x1f)]
                               [(int)((uVar39 & pVVar16->PageMask) * pVVar16->nEntrySize)];
                      uVar40 = -(ulong)((uVar42 & 1) != fCompl1) ^
                               pVVar16->ppPages[uVar44 >> (bVar26 & 0x1f)]
                               [(int)((uVar44 & pVVar16->PageMask) * pVVar16->nEntrySize)];
                      uVar21 = (*(uint *)&local_17b8->field_0x14 >> 0x18) - 1;
                      if ((0xffffff < uVar37) && (0xffffff < *(uint *)&local_17b8->field_0x14)) {
                        lVar30 = uVar25 * 0x18 + 0x9f8108;
                        uVar41 = uVar25;
                        do {
                          uVar32 = uVar41 - 1;
                          iVar47 = *(int *)((long)&local_17b8[1].Sign + (ulong)uVar21 * 4);
                          if (*(int *)(&pLVar24->field_0x14 + uVar41 * 4) <= iVar47) {
                            if (*(int *)(&pLVar24->field_0x14 + uVar41 * 4) != iVar47)
                            goto LAB_0072a068;
                            if ((long)(int)uVar21 < (long)uVar32) {
                              bVar26 = (char)(-1 << ((byte)uVar21 & 0x1f)) +
                                       (char)(1 << ((byte)uVar32 & 0x1f));
                              lVar45 = (ulong)uVar21 * 0x90;
                              uVar31 = (uVar31 & *(ulong *)(lVar30 + lVar45)) >> (bVar26 & 0x3f) |
                                       (*(ulong *)(lVar30 + -8 + lVar45) & uVar31) <<
                                       (bVar26 & 0x3f) |
                                       *(ulong *)(lVar30 + -0x10 + lVar45) & uVar31;
                            }
                            uVar21 = uVar21 - 1;
                          }
                        } while ((1 < (long)uVar41) &&
                                (lVar30 = lVar30 + -0x18, uVar41 = uVar32, -1 < (int)uVar21));
                      }
                      if (uVar21 != 0xffffffff) {
LAB_0072a141:
                        __assert_fail("k == -1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                      ,0x63b,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                      }
                      uVar21 = (*(uint *)&pLVar22->field_0x14 >> 0x18) - 1;
                      if ((0xffffff < uVar37) && (0xffffff < *(uint *)&pLVar22->field_0x14)) {
                        lVar30 = uVar25 * 0x18 + 0x9f8108;
                        uVar41 = uVar25;
                        do {
                          uVar32 = uVar41 - 1;
                          iVar47 = *(int *)((long)&pLVar22[1].Sign + (ulong)uVar21 * 4);
                          if (*(int *)(&pLVar24->field_0x14 + uVar41 * 4) <= iVar47) {
                            if (*(int *)(&pLVar24->field_0x14 + uVar41 * 4) != iVar47) {
LAB_0072a068:
                              __assert_fail("pCut[i] == pCut0[k]",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                            ,0x636,
                                            "word Abc_Tt6Expand(word, int *, int, int *, int)");
                            }
                            if ((long)(int)uVar21 < (long)uVar32) {
                              bVar26 = (char)(-1 << ((byte)uVar21 & 0x1f)) +
                                       (char)(1 << ((byte)uVar32 & 0x1f));
                              lVar45 = (ulong)uVar21 * 0x90;
                              uVar40 = (uVar40 & *(ulong *)(lVar30 + lVar45)) >> (bVar26 & 0x3f) |
                                       (*(ulong *)(lVar30 + -8 + lVar45) & uVar40) <<
                                       (bVar26 & 0x3f) |
                                       *(ulong *)(lVar30 + -0x10 + lVar45) & uVar40;
                            }
                            uVar21 = uVar21 - 1;
                          }
                        } while ((1 < (long)uVar41) &&
                                (lVar30 = lVar30 + -0x18, uVar41 = uVar32, -1 < (int)uVar21));
                      }
                      if (uVar21 != 0xffffffff) goto LAB_0072a141;
                      uVar41 = uVar40 & uVar31;
                      if ((bVar55 && -1 < (int)uVar29) && bVar53) {
                        uVar41 = uVar40 ^ uVar31;
                      }
                      uVar39 = (uint)uVar41 & 1;
                      uTruth[0] = -(ulong)uVar39 ^ uVar41;
                      uVar21 = 0;
                      uVar31 = uTruth[0];
                      if (0xffffff < uVar37) {
                        uVar40 = 0;
                        lVar30 = 0x9f8118;
                        pwVar46 = s_Truths6Neg;
                        uVar21 = 0;
                        do {
                          bVar26 = (byte)(1 << ((byte)uVar40 & 0x1f));
                          if ((*pwVar46 & (uVar31 >> (bVar26 & 0x3f) ^ uVar31)) != 0) {
                            lVar45 = (long)(int)uVar21;
                            if (lVar45 < (long)uVar40) {
                              *(int *)((long)&pLVar23->Sign + lVar45 * 4) =
                                   *(int *)((long)&pLVar23->Sign + uVar40 * 4);
                              bVar26 = (char)(-1 << ((byte)uVar21 & 0x1f)) + bVar26;
                              lVar45 = lVar45 * 0x90;
                              uVar31 = (uVar31 & *(ulong *)(lVar30 + 8 + lVar45)) >> (bVar26 & 0x3f)
                                       | (*(ulong *)(lVar30 + lVar45) & uVar31) << (bVar26 & 0x3f) |
                                         *(ulong *)(lVar30 + -8 + lVar45) & uVar31;
                            }
                            uVar21 = uVar21 + 1;
                          }
                          uVar40 = uVar40 + 1;
                          pwVar46 = pwVar46 + 1;
                          lVar30 = lVar30 + 0x18;
                        } while (uVar25 != uVar40);
                      }
                      uVar25 = uTruth[0];
                      if ((uVar21 != uVar36) && (uVar25 = uVar31, (int)uVar36 <= (int)uVar21)) {
                        __assert_fail("k < nVars",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                      ,0x65d,"int Abc_Tt6MinBase(word *, int *, int)");
                      }
                      uTruth[0] = uVar25;
                      pLVar24->field_0x17 = (char)uVar21;
                      if ((uTruth[0] & 1) != 0) {
                        __assert_fail("(int)(t & 1) == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                      ,0x3d1,
                                      "int Lf_CutComputeTruth6(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                     );
                      }
                      iVar47 = Vec_MemHashInsert(p->vTtMem,uTruth);
                      if (iVar47 < 0) {
LAB_0072a160:
                        __assert_fail("Var >= 0 && !(c >> 1)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                      ,0x12e,"int Abc_Var2Lit(int, int)");
                      }
                      pLVar24->iFunc = uVar39 + iVar47 * 2;
                      uVar21 = *(uint *)&pLVar24->field_0x14 >> 0x18;
                      bVar54 = uVar21 < uVar36;
                      if (uVar36 < uVar21) {
                        __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                      ,0x3d5,
                                      "int Lf_CutComputeTruth6(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                     );
                      }
                    }
                    else {
                      iVar47 = pJVar7->nLutSize;
                      uVar21 = 1 << ((char)iVar47 - 6U & 0x1f);
                      if (iVar47 < 7) {
                        uVar21 = 1;
                      }
                      uVar25 = (ulong)uVar21;
                      uVar39 = local_17b8->iFunc;
                      if ((int)uVar39 < 0) goto LAB_0072a0a6;
                      pVVar16 = p->vTtMem;
                      uVar42 = uVar39 >> 1;
                      if (pVVar16->nEntries <= (int)uVar42) {
LAB_0072a0c5:
                        __assert_fail("i >= 0 && i < p->nEntries",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecMem.h"
                                      ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                      }
                      bVar26 = (byte)pVVar16->LogPageSze;
                      uVar44 = pLVar22->iFunc;
                      if ((int)uVar44 < 0) goto LAB_0072a0a6;
                      uVar37 = uVar44 >> 1;
                      if (pVVar16->nEntries <= (int)uVar37) goto LAB_0072a0c5;
                      uVar36 = *(uint *)&pLVar24->field_0x14;
                      iVar19 = (uVar42 & pVVar16->PageMask) * pVVar16->nEntrySize;
                      pwVar46 = pVVar16->ppPages[uVar42 >> (bVar26 & 0x1f)];
                      iVar20 = (uVar37 & pVVar16->PageMask) * pVVar16->nEntrySize;
                      pwVar13 = pVVar16->ppPages[uVar37 >> (bVar26 & 0x1f)];
                      if ((uVar39 & 1) == uVar34) {
                        if (0 < (int)uVar21) {
                          uVar31 = 0;
                          do {
                            uTruth0[uVar31] = pwVar46[(long)iVar19 + uVar31];
                            uVar31 = uVar31 + 1;
                          } while (uVar25 != uVar31);
                        }
                      }
                      else if (0 < (int)uVar21) {
                        uVar31 = 0;
                        do {
                          uTruth0[uVar31] = ~pwVar46[(long)iVar19 + uVar31];
                          uVar31 = uVar31 + 1;
                        } while (uVar25 != uVar31);
                      }
                      if ((uVar44 & 1) == fCompl1) {
                        if (0 < (int)uVar21) {
                          uVar31 = 0;
                          do {
                            local_1238[uVar31] = pwVar13[(long)iVar20 + uVar31];
                            uVar31 = uVar31 + 1;
                          } while (uVar21 != uVar31);
                        }
                      }
                      else if (0 < (int)uVar21) {
                        uVar31 = 0;
                        do {
                          local_1238[uVar31] = ~pwVar13[(long)iVar20 + uVar31];
                          uVar31 = uVar31 + 1;
                        } while (uVar25 != uVar31);
                      }
                      uVar39 = uVar36 >> 0x18;
                      uVar31 = (ulong)uVar39;
                      uVar42 = (*(uint *)&local_17b8->field_0x14 >> 0x18) - 1;
                      if ((0xffffff < uVar36) && (0xffffff < *(uint *)&local_17b8->field_0x14)) {
                        do {
                          uVar40 = uVar31 - 1;
                          iVar19 = *(int *)((long)&local_17b8[1].Sign + (ulong)uVar42 * 4);
                          if (*(int *)(&pLVar24->field_0x14 + uVar31 * 4) <= iVar19) {
                            if (*(int *)(&pLVar24->field_0x14 + uVar31 * 4) != iVar19)
                            goto LAB_0072a087;
                            if ((long)(int)uVar42 < (long)uVar40) {
                              Abc_TtSwapVars(uTruth0,iVar47,uVar42,(int)uVar40);
                            }
                            uVar42 = uVar42 - 1;
                          }
                        } while ((1 < (long)uVar31) && (uVar31 = uVar40, -1 < (int)uVar42));
                      }
                      if (uVar42 != 0xffffffff) {
LAB_0072a122:
                        __assert_fail("k == -1",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                      ,0x64a,
                                      "void Abc_TtExpand(word *, int, int *, int, int *, int)");
                      }
                      uVar42 = (*(uint *)&pLVar22->field_0x14 >> 0x18) - 1;
                      if ((0xffffff < *(uint *)&pLVar22->field_0x14) &&
                         (0xffffff < *(uint *)&pLVar24->field_0x14)) {
                        uVar31 = (ulong)(*(uint *)&pLVar24->field_0x14 >> 0x18);
                        do {
                          uVar40 = uVar31 - 1;
                          iVar19 = *(int *)((long)&pLVar22[1].Sign + (ulong)uVar42 * 4);
                          if (*(int *)(&pLVar24->field_0x14 + uVar31 * 4) <= iVar19) {
                            if (*(int *)(&pLVar24->field_0x14 + uVar31 * 4) != iVar19) {
LAB_0072a087:
                              __assert_fail("pCut[i] == pCut0[k]",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                            ,0x645,
                                            "void Abc_TtExpand(word *, int, int *, int, int *, int)"
                                           );
                            }
                            if ((long)(int)uVar42 < (long)uVar40) {
                              Abc_TtSwapVars(local_1238,iVar47,uVar42,(int)uVar40);
                            }
                            uVar42 = uVar42 - 1;
                          }
                        } while ((1 < (long)uVar31) && (uVar31 = uVar40, -1 < (int)uVar42));
                      }
                      if (uVar42 != 0xffffffff) goto LAB_0072a122;
                      if ((bVar55 && -1 < (int)uVar29) && bVar53) {
                        uVar42 = ((uint)local_1238[0] ^ (uint)uTruth0[0]) & 1;
                        if (uVar42 == 0) {
                          if (0 < (int)uVar21) {
                            uVar25 = 0;
                            do {
                              uTruth[uVar25] = local_1238[uVar25] ^ uTruth0[uVar25];
                              uVar25 = uVar25 + 1;
                            } while (uVar21 != uVar25);
                          }
                        }
                        else if (0 < (int)uVar21) {
                          uVar31 = 0;
                          do {
                            uTruth[uVar31] = ~(uTruth0[uVar31] ^ local_1238[uVar31]);
                            uVar31 = uVar31 + 1;
                          } while (uVar25 != uVar31);
                        }
                      }
                      else {
                        uVar42 = (uint)local_1238[0] & (uint)uTruth0[0] & 1;
                        if (uVar42 == 0) {
                          if (0 < (int)uVar21) {
                            uVar31 = 0;
                            do {
                              uTruth[uVar31] = local_1238[uVar31] & uTruth0[uVar31];
                              uVar31 = uVar31 + 1;
                            } while (uVar25 != uVar31);
                          }
                        }
                        else if (0 < (int)uVar21) {
                          uVar31 = 0;
                          do {
                            uTruth[uVar31] = ~(local_1238[uVar31] & uTruth0[uVar31]);
                            uVar31 = uVar31 + 1;
                          } while (uVar25 != uVar31);
                        }
                      }
                      iVar47 = Abc_TtMinBase(uTruth,(int *)pLVar23,(uint)(byte)pLVar24->field_0x17,
                                             iVar47);
                      pLVar24->field_0x17 = (char)iVar47;
                      if ((uTruth[0] & 1) != 0) {
                        __assert_fail("(uTruth[0] & 1) == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                      ,0x3ed,
                                      "int Lf_CutComputeTruth(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                     );
                      }
                      iVar47 = Vec_MemHashInsert(p->vTtMem,uTruth);
                      if (iVar47 < 0) goto LAB_0072a160;
                      pLVar24->iFunc = uVar42 + iVar47 * 2;
                      uVar21 = *(uint *)&pLVar24->field_0x14 >> 0x18;
                      bVar54 = uVar21 < uVar39;
                      if (!bVar54 && uVar21 != uVar39) {
                        __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                      ,0x3f1,
                                      "int Lf_CutComputeTruth(Lf_Man_t *, Lf_Cut_t *, Lf_Cut_t *, int, int, Lf_Cut_t *, int)"
                                     );
                      }
                    }
                    if (bVar54) {
                      if (*(uint *)&pLVar24->field_0x14 < 0x1000000) {
                        uVar25 = 0;
                      }
                      else {
                        uVar31 = 0;
                        uVar25 = 0;
                        do {
                          uVar25 = uVar25 | 1L << ((ulong)*(byte *)((long)&pLVar23->Sign +
                                                                   uVar31 * 4) & 0x3f);
                          uVar31 = uVar31 + 1;
                        } while (*(uint *)&pLVar24->field_0x14 >> 0x18 != uVar31);
                      }
                      pLVar24->Sign = uVar25;
                    }
                  }
                  uVar21 = p->pPars->nLutSizeMux;
                  if ((uVar21 != 0) &&
                     (uVar39 = *(uint *)&pLVar24->field_0x14 >> 0x18, uVar21 == uVar39)) {
                    if (pLVar24->iFunc < 0) goto LAB_0072a0a6;
                    pVVar16 = p->vTtMem;
                    uVar21 = (uint)pLVar24->iFunc >> 1;
                    if (pVVar16->nEntries <= (int)uVar21) goto LAB_0072a0c5;
                    iVar47 = Lf_ManFindCofVar(pVVar16->ppPages
                                              [uVar21 >> ((byte)pVVar16->LogPageSze & 0x1f)] +
                                              (ulong)(uVar21 & pVVar16->PageMask) *
                                              (long)pVVar16->nEntrySize,iVar48,uVar39);
                    if (iVar47 == -1) goto LAB_00729195;
                  }
                  Lf_CutParams(p,pLVar24,local_17d4,FlowRefs,pMux);
                  uVar28 = Lf_SetAddCut(pCutsR,uVar28,nCutNum_00);
                }
                else {
                  iVar47 = 0;
                  uVar25 = 0;
                  if (uVar21 < 0x1000000) {
LAB_00728772:
                    if ((int)((int)uVar25 + uVar42) <= (int)(iVar47 + uVar5)) {
                      if (iVar47 < (int)uVar42) {
                        uVar25 = (ulong)(int)uVar25;
                        uVar31 = (ulong)iVar47;
                        do {
                          lVar30 = uVar31 * 4;
                          uVar31 = uVar31 + 1;
                          *(int *)((long)&pLVar23->Sign + uVar25 * 4) =
                               *(int *)((long)&pLVar22[1].Sign + lVar30);
                          uVar25 = uVar25 + 1;
                        } while (uVar42 != uVar31);
                      }
LAB_007287e2:
                      pLVar24->iFunc = -1;
                      *(uint *)&pLVar24->field_0x14 =
                           *(uint *)&pLVar24->field_0x14 & 0x7fffff | (int)uVar25 << 0x18;
                      goto LAB_007287fe;
                    }
                  }
                  else {
                    iVar19 = 0;
                    uVar25 = 0;
                    if (*(uint *)&pLVar22->field_0x14 < 0x1000000) {
LAB_007287b4:
                      if ((int)((int)uVar25 + uVar39) <= (int)(iVar19 + uVar5)) {
                        if (iVar19 < (int)uVar39) {
                          uVar25 = (ulong)(int)uVar25;
                          uVar31 = (ulong)iVar19;
                          do {
                            lVar30 = uVar31 * 4;
                            uVar31 = uVar31 + 1;
                            *(int *)((long)&pLVar23->Sign + uVar25 * 4) =
                                 *(int *)((long)&local_17b8[1].Sign + lVar30);
                            uVar25 = uVar25 + 1;
                          } while (uVar39 != uVar31);
                        }
                        goto LAB_007287e2;
                      }
                    }
                    else if (uVar5 != 0) {
                      lVar30 = 0;
                      iVar19 = 0;
                      iVar20 = 0;
                      do {
                        iVar47 = *(int *)((long)&local_17b8[1].Sign + (long)iVar19 * 4);
                        iVar33 = *(int *)((long)&pLVar22[1].Sign + (long)iVar20 * 4);
                        if (iVar47 < iVar33) {
                          iVar19 = iVar19 + 1;
                          *(int *)((long)&pLVar23->Sign + lVar30 * 4) = iVar47;
                          iVar47 = iVar20;
                          if ((int)uVar39 <= iVar19) {
LAB_007291b4:
                            uVar25 = (ulong)((int)lVar30 + 1);
                            goto LAB_00728772;
                          }
                        }
                        else {
                          if (iVar33 < iVar47) {
                            *(int *)((long)&pLVar23->Sign + lVar30 * 4) = iVar33;
                          }
                          else {
                            iVar19 = iVar19 + 1;
                            *(int *)((long)&pLVar23->Sign + lVar30 * 4) = iVar47;
                            iVar47 = iVar20 + 1;
                            if ((int)uVar39 <= iVar19) goto LAB_007291b4;
                          }
                          iVar20 = iVar20 + 1;
                          if ((int)uVar42 <= iVar20) {
                            uVar25 = (ulong)((int)lVar30 + 1);
                            goto LAB_007287b4;
                          }
                        }
                        lVar30 = lVar30 + 1;
                      } while (uVar5 != (uint)lVar30);
                    }
                  }
                }
              }
LAB_00729195:
              pLVar22 = (Lf_Cut_t *)(&pLVar22->Sign + lVar35);
              iVar27 = iVar27 + 1;
            } while (iVar27 != local_17e4);
          }
          local_17b8 = (Lf_Cut_t *)(&local_17b8->Sign + lVar35);
          uVar18 = uVar18 + 1;
        } while (uVar18 != local_17d8);
      }
    }
    else {
      if (puVar11 == (uint *)0x0) {
        uVar29 = 0;
      }
      else {
        pGVar12 = pGVar8->pObjs;
        if ((pMux < pGVar12) || (pGVar12 + pGVar8->nObjs <= pMux)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if ((int)puVar11[(int)((ulong)((long)pMux - (long)pGVar12) >> 2) * -0x55555555] < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        uVar29 = puVar11[(int)((ulong)((long)pMux - (long)pGVar12) >> 2) * -0x55555555] & 1;
      }
      uVar18 = 0xffffffff;
      if (puVar11 != (uint *)0x0) {
        uVar21 = puVar11[(uint)iObj];
        if (uVar21 != 0) {
          if ((int)uVar21 < 0) goto LAB_0072a0a6;
          uVar18 = uVar21 >> 1;
        }
      }
      if (((int)uVar18 < 0) || ((p->vOffsets).nSize <= (int)uVar18)) goto LAB_0072a103;
      if ((p->vOffsets).pArray[uVar18] == -1) {
        Lf_ManPrepareSet_CutTemp._176_4_ = 2;
        Lf_ManPrepareSet_CutTemp._180_4_ = Lf_ManPrepareSet_CutTemp._180_4_ & 0x3fffff | 0x1000000;
        Lf_ManPrepareSet_CutTemp._160_8_ = 1L << ((byte)uVar18 & 0x3f);
        local_1760 = (Lf_Cut_t *)(Lf_ManPrepareSet_CutTemp + 0xa0);
        iVar48 = 1;
        Lf_ManPrepareSet_CutTemp._184_4_ = uVar18;
      }
      else {
        iVar27 = p->pPars->nCutNum;
        local_1760 = Lf_ManFetchSet(p,uVar18);
        if (iVar27 < 1) {
          iVar48 = 0;
        }
        else {
          iVar47 = 0;
          pLVar22 = local_1760;
          do {
            iVar48 = iVar47;
            if (0xfeffffff < *(uint *)&pLVar22->field_0x14) break;
            pLVar22 = (Lf_Cut_t *)(&pLVar22->Sign + p->nCutWords);
            iVar47 = iVar47 + 1;
            iVar48 = iVar27;
          } while (iVar27 != iVar47);
        }
      }
      p->CutCount[0] = (double)(int)(local_17e4 * local_17d8 * iVar48) + p->CutCount[0];
      if ((int)local_17d8 < 1) {
        pLVar22 = (Lf_Cut_t *)0x0;
      }
      else {
        uVar18 = 0;
        iVar27 = 1 << ((char)uVar5 - 6U & 0x1f);
        if ((int)uVar5 < 7) {
          iVar27 = 1;
        }
        pLVar22 = (Lf_Cut_t *)0x0;
        pLVar23 = local_17b8;
        do {
          if (((int)(uint)(byte)pLVar23->field_0x17 <= (int)uVar5) && (0 < local_17e4)) {
            iVar47 = 0;
            pLVar24 = local_1768;
            do {
              if (((int)(uint)(byte)pLVar24->field_0x17 <= (int)uVar5) && (0 < iVar48)) {
                iVar19 = 0;
                pLVar52 = local_1760;
                do {
                  if (((int)(uint)(byte)pLVar52->field_0x17 <= (int)uVar5) &&
                     (uVar25 = pLVar24->Sign | pLVar23->Sign | pLVar52->Sign,
                     uVar25 = uVar25 - (uVar25 >> 1 & 0x5555555555555555),
                     uVar25 = (uVar25 >> 2 & 0x3333333333333333) + (uVar25 & 0x3333333333333333),
                     pLVar22 = pLVar52,
                     (int)(uint)(byte)(((uVar25 >> 4) + uVar25 & 0xf0f0f0f0f0f0f0f) *
                                       0x101010101010101 >> 0x38) <= (int)uVar5)) {
                    p->CutCount[1] = p->CutCount[1] + 1.0;
                    pLVar17 = pCutsR[(int)uVar28];
                    bVar26 = pLVar23->field_0x17;
                    bVar2 = pLVar24->field_0x17;
                    bVar3 = pLVar52->field_0x17;
                    iVar20 = 0;
                    uVar25 = 0;
                    uVar21 = 0;
                    uVar39 = 0;
                    uVar42 = 0;
                    while( true ) {
                      iVar49 = 1000000000;
                      iVar33 = 1000000000;
                      if (uVar42 != bVar26) {
                        iVar33 = *(int *)((long)&pLVar23[1].Sign + (ulong)uVar42 * 4);
                      }
                      if (uVar39 != bVar2) {
                        iVar49 = *(int *)((long)&pLVar24[1].Sign + (ulong)uVar39 * 4);
                      }
                      iVar51 = 1000000000;
                      if (uVar21 != bVar3) {
                        iVar51 = *(int *)((long)&pLVar52[1].Sign + (ulong)uVar21 * 4);
                      }
                      iVar43 = iVar49;
                      if (iVar33 < iVar49) {
                        iVar43 = iVar33;
                      }
                      iVar50 = iVar51;
                      if (iVar43 < iVar51) {
                        iVar50 = iVar43;
                      }
                      if (iVar50 == 1000000000) break;
                      if (uVar5 == uVar25) goto LAB_0072955a;
                      *(int *)((long)&pLVar17[1].Sign + uVar25 * 4) = iVar50;
                      uVar25 = uVar25 + 1;
                      uVar42 = uVar42 + (iVar33 == iVar50);
                      uVar39 = uVar39 + (iVar49 == iVar50);
                      uVar21 = uVar21 + (iVar51 <= iVar43);
                      iVar20 = iVar20 + -0x1000000;
                    }
                    pLVar17->iFunc = -1;
                    *(uint *)&pLVar17->field_0x14 =
                         (*(uint *)&pLVar17->field_0x14 & 0xffffff) - iVar20 & 0xff7fffff;
                    pLVar17->Sign = pLVar24->Sign | pLVar23->Sign | pLVar52->Sign;
LAB_0072955a:
                    if (iVar50 == 1000000000) {
                      if (0 < (int)uVar28) {
                        pLVar14 = pCutsR[uVar28];
                        uVar21 = *(uint *)&pLVar14->field_0x14 >> 0x18;
                        uVar25 = 0;
                        do {
                          pLVar15 = pCutsR[uVar25];
                          uVar39 = *(uint *)&pLVar15->field_0x14 >> 0x18;
                          if ((uVar39 <= uVar21) && ((pLVar15->Sign & ~pLVar14->Sign) == 0)) {
                            if (uVar21 == uVar39) {
                              if (*(uint *)&pLVar14->field_0x14 < 0x1000000) goto LAB_0072981a;
                              uVar31 = 0;
                              while (*(int *)((long)&pLVar14[1].Sign + uVar31 * 4) ==
                                     *(int *)((long)&pLVar15[1].Sign + uVar31 * 4)) {
                                uVar31 = uVar31 + 1;
                                if (uVar21 == uVar31) goto LAB_0072981a;
                              }
                            }
                            else {
                              if (uVar21 <= uVar39) goto LAB_0072a049;
                              if (*(uint *)&pLVar15->field_0x14 < 0x1000000) goto LAB_0072981a;
                              uVar31 = 0;
                              uVar42 = 0;
                              do {
                                iVar20 = *(int *)((long)&pLVar15[1].Sign + (long)(int)uVar42 * 4);
                                iVar33 = *(int *)((long)&pLVar14[1].Sign + uVar31 * 4);
                                if (iVar20 < iVar33) break;
                                if ((iVar33 == iVar20) && (uVar42 = uVar42 + 1, uVar42 == uVar39))
                                goto LAB_0072981a;
                                uVar31 = uVar31 + 1;
                              } while (uVar21 != uVar31);
                            }
                          }
                          uVar25 = uVar25 + 1;
                        } while (uVar25 != uVar28);
                      }
                      p->CutCount[2] = p->CutCount[2] + 1.0;
                      if ((p->pPars->fCutMin != 0) &&
                         (iVar20 = Lf_CutComputeTruthMux
                                             (p,pLVar23,pLVar24,pLVar52,uVar34,fCompl1,uVar29,
                                              pLVar17), iVar20 != 0)) {
                        if (*(uint *)&pLVar17->field_0x14 < 0x1000000) {
                          uVar25 = 0;
                        }
                        else {
                          uVar31 = 0;
                          uVar25 = 0;
                          do {
                            uVar25 = uVar25 | 1L << ((ulong)*(byte *)((long)&pLVar17[1].Sign +
                                                                     uVar31 * 4) & 0x3f);
                            uVar31 = uVar31 + 1;
                          } while (*(uint *)&pLVar17->field_0x14 >> 0x18 != uVar31);
                        }
                        pLVar17->Sign = uVar25;
                      }
                      uVar21 = p->pPars->nLutSizeMux;
                      if ((uVar21 != 0) &&
                         (uVar39 = *(uint *)&pLVar17->field_0x14 >> 0x18, uVar21 == uVar39)) {
                        if (pLVar17->iFunc < 0) goto LAB_0072a0a6;
                        pVVar16 = p->vTtMem;
                        uVar21 = (uint)pLVar17->iFunc >> 1;
                        if (pVVar16->nEntries <= (int)uVar21) goto LAB_0072a0c5;
                        iVar20 = Lf_ManFindCofVar(pVVar16->ppPages
                                                  [uVar21 >> ((byte)pVVar16->LogPageSze & 0x1f)] +
                                                  (ulong)(uVar21 & pVVar16->PageMask) *
                                                  (long)pVVar16->nEntrySize,iVar27,uVar39);
                        if (iVar20 == -1) goto LAB_0072981a;
                      }
                      Lf_CutParams(p,pLVar17,local_17d4,FlowRefs,pMux);
                      uVar28 = Lf_SetAddCut(pCutsR,uVar28,nCutNum_00);
                    }
                  }
LAB_0072981a:
                  pLVar52 = (Lf_Cut_t *)(&pLVar52->Sign + lVar35);
                  iVar19 = iVar19 + 1;
                } while (iVar19 != iVar48);
              }
              pLVar24 = (Lf_Cut_t *)(&pLVar24->Sign + lVar35);
              iVar47 = iVar47 + 1;
            } while (iVar47 != local_17e4);
          }
          pLVar23 = (Lf_Cut_t *)(&pLVar23->Sign + lVar35);
          uVar18 = uVar18 + 1;
        } while (uVar18 != local_17d8);
      }
      if (p->pPars->fCutGroup != 0) {
        if (pLVar22->field_0x17 != '\x01') {
          __assert_fail("pCutSave->nLeaves == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                        ,0x4fd,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
        }
        puVar11 = p->pGia->pMuxes;
        uVar18 = 0xffffffff;
        if (puVar11 != (uint *)0x0) {
          uVar21 = puVar11[(uint)iObj];
          if (uVar21 != 0) {
            if ((int)uVar21 < 0) goto LAB_0072a0a6;
            uVar18 = uVar21 >> 1;
          }
        }
        if ((uint)pLVar22[1].Sign != uVar18) {
          __assert_fail("pCutSave->pLeaves[0] == Gia_ObjFaninId2(p->pGia, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                        ,0x4fe,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
        }
        if (0 < (int)local_17d8) {
          uVar18 = 0;
          do {
            if (((int)(uint)(byte)local_17b8->field_0x17 <= (int)uVar5) && (0 < local_17e4)) {
              iVar48 = 0;
              pLVar23 = local_1768;
              do {
                uVar21 = *(uint *)&pLVar23->field_0x14 >> 0x18;
                if ((int)uVar21 <= (int)uVar5) {
                  uVar39 = p->pPars->nLutSize;
                  if ((int)uVar39 <= (int)((byte)local_17b8->field_0x17 + uVar21)) {
                    __assert_fail("(int)pCut0->nLeaves + (int)pCut1->nLeaves + 1 <= p->pPars->nLutSize"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                  ,0x502,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
                  }
                  p->CutCount[1] = p->CutCount[1] + 1.0;
                  pLVar24 = pCutsR[(int)uVar28];
                  bVar26 = local_17b8->field_0x17;
                  bVar2 = pLVar23->field_0x17;
                  bVar3 = pLVar22->field_0x17;
                  iVar27 = 0;
                  uVar25 = 0;
                  uVar21 = 0;
                  uVar42 = 0;
                  uVar44 = 0;
                  while( true ) {
                    iVar19 = 1000000000;
                    iVar47 = 1000000000;
                    if (uVar44 != bVar26) {
                      iVar47 = *(int *)((long)&local_17b8[1].Sign + (ulong)uVar44 * 4);
                    }
                    if (uVar42 != bVar2) {
                      iVar19 = *(int *)((long)&pLVar23[1].Sign + (ulong)uVar42 * 4);
                    }
                    iVar20 = 1000000000;
                    if (uVar21 != bVar3) {
                      iVar20 = *(int *)((long)&pLVar22[1].Sign + (ulong)uVar21 * 4);
                    }
                    iVar33 = iVar19;
                    if (iVar47 < iVar19) {
                      iVar33 = iVar47;
                    }
                    iVar49 = iVar20;
                    if (iVar33 < iVar20) {
                      iVar49 = iVar33;
                    }
                    if (iVar49 == 1000000000) break;
                    if (uVar39 == uVar25) goto LAB_00729a79;
                    *(int *)((long)&pLVar24[1].Sign + uVar25 * 4) = iVar49;
                    uVar25 = uVar25 + 1;
                    uVar44 = uVar44 + (iVar47 == iVar49);
                    uVar42 = uVar42 + (iVar19 == iVar49);
                    uVar21 = uVar21 + (iVar20 <= iVar33);
                    iVar27 = iVar27 + -0x1000000;
                  }
                  pLVar24->iFunc = -1;
                  *(uint *)&pLVar24->field_0x14 =
                       (*(uint *)&pLVar24->field_0x14 & 0xffffff) - iVar27 & 0xff7fffff;
                  pLVar24->Sign = pLVar23->Sign | local_17b8->Sign | pLVar22->Sign;
LAB_00729a79:
                  if (iVar49 == 1000000000) {
                    if (0 < (int)uVar28) {
                      pLVar52 = pCutsR[uVar28];
                      uVar21 = *(uint *)&pLVar52->field_0x14 >> 0x18;
                      uVar25 = 0;
                      do {
                        pLVar17 = pCutsR[uVar25];
                        uVar39 = *(uint *)&pLVar17->field_0x14 >> 0x18;
                        if ((uVar39 <= uVar21) && ((pLVar17->Sign & ~pLVar52->Sign) == 0)) {
                          if (uVar21 == uVar39) {
                            if (*(uint *)&pLVar52->field_0x14 < 0x1000000) goto LAB_00729c57;
                            uVar31 = 0;
                            while (*(int *)((long)&pLVar52[1].Sign + uVar31 * 4) ==
                                   *(int *)((long)&pLVar17[1].Sign + uVar31 * 4)) {
                              uVar31 = uVar31 + 1;
                              if (uVar21 == uVar31) goto LAB_00729c57;
                            }
                          }
                          else {
                            if (uVar21 <= uVar39) {
LAB_0072a049:
                              __assert_fail("nSizeB > nSizeC",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                                            ,0x329,
                                            "int Lf_SetCutIsContainedOrder(Lf_Cut_t *, Lf_Cut_t *)")
                              ;
                            }
                            if (*(uint *)&pLVar17->field_0x14 < 0x1000000) goto LAB_00729c57;
                            uVar31 = 0;
                            uVar42 = 0;
                            do {
                              iVar27 = *(int *)((long)&pLVar17[1].Sign + (long)(int)uVar42 * 4);
                              iVar47 = *(int *)((long)&pLVar52[1].Sign + uVar31 * 4);
                              if (iVar27 < iVar47) break;
                              if ((iVar47 == iVar27) && (uVar42 = uVar42 + 1, uVar42 == uVar39))
                              goto LAB_00729c57;
                              uVar31 = uVar31 + 1;
                            } while (uVar21 != uVar31);
                          }
                        }
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar28);
                    }
                    p->CutCount[2] = p->CutCount[2] + 1.0;
                    if ((p->pPars->fCutMin != 0) &&
                       (iVar27 = Lf_CutComputeTruthMux
                                           (p,local_17b8,pLVar23,pLVar22,uVar34,fCompl1,uVar29,
                                            pLVar24), iVar27 != 0)) {
                      if (*(uint *)&pLVar24->field_0x14 < 0x1000000) {
                        uVar25 = 0;
                      }
                      else {
                        uVar31 = 0;
                        uVar25 = 0;
                        do {
                          uVar25 = uVar25 | 1L << ((ulong)*(byte *)((long)&pLVar24[1].Sign +
                                                                   uVar31 * 4) & 0x3f);
                          uVar31 = uVar31 + 1;
                        } while (*(uint *)&pLVar24->field_0x14 >> 0x18 != uVar31);
                      }
                      pLVar24->Sign = uVar25;
                    }
                    Lf_CutParams(p,pLVar24,local_17d4,FlowRefs,pMux);
                    uVar28 = Lf_SetAddCut(pCutsR,uVar28,nCutNum_00);
                  }
                }
LAB_00729c57:
                pLVar23 = (Lf_Cut_t *)(&pLVar23->Sign + lVar35);
                iVar48 = iVar48 + 1;
              } while (iVar48 != local_17e4);
            }
            local_17b8 = (Lf_Cut_t *)(&local_17b8->Sign + lVar35);
            uVar18 = uVar18 + 1;
          } while (uVar18 != local_17d8);
        }
      }
    }
    if (((int)uVar28 < 1) || ((int)nCutNum_00 <= (int)uVar28)) {
      __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                    ,0x536,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
    }
    if ((uVar28 != 1) && (pCutsR[1]->Delay < pCutsR[0]->Delay)) {
      __assert_fail("nCutsR == 1 || pCutsR[0]->Delay <= pCutsR[1]->Delay",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                    ,0x539,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
    }
    *(byte *)(pLVar38->Cut + 1) = *(byte *)(pLVar38->Cut + 1) & 0xfe;
    *(byte *)pLVar38->Cut = *(byte *)pLVar38->Cut & 0xfe;
    iVar48 = Lf_MemSaveCut(&p->vStoreNew,pCutsR[0],iObj);
    pLVar22 = pCutsR[1];
    LVar4 = pLVar38->Cut[0];
    pLVar38->Cut[1] = (Lf_Plc_t)(((uint)pLVar38->Cut[1] & 1) + iVar48 * 2);
    pLVar38->Cut[0] = (Lf_Plc_t)(((uint)LVar4 & 1) + iVar48 * 2);
    iVar48 = pCutsR[0]->Delay;
    pLVar38->Delay[1] = iVar48;
    pLVar38->Delay[0] = iVar48;
    fVar1 = pCutsR[0]->Flow;
    pLVar38->Flow[1] = fVar1;
    pLVar38->Flow[0] = fVar1;
    p->nCutCounts[(byte)pCutsR[0]->field_0x17] = p->nCutCounts[(byte)pCutsR[0]->field_0x17] + 1;
    p->nCutEqual = p->nCutEqual + 1;
    p->CutCount[3] = (double)(int)uVar28 + p->CutCount[3];
    if ((uVar28 == 1) || (pCutsR[0]->Flow <= pCutsR[1]->Flow + 0.005)) {
      uVar25 = 0;
    }
    else {
      iVar48 = Lf_MemSaveCut(&p->vStoreNew,pCutsR[1],iObj);
      pLVar38->Cut[1] = (Lf_Plc_t)(((uint)pLVar38->Cut[1] & 1) + iVar48 * 2);
      pLVar38->Delay[1] = pLVar22->Delay;
      pLVar38->Flow[1] = pLVar22->Flow;
      p->nCutCounts[(byte)pLVar22->field_0x17] = p->nCutCounts[(byte)pLVar22->field_0x17] + 1;
      p->nCutEqual = p->nCutEqual + -1;
      uVar25 = (ulong)((pLVar22->field_0x16 & 0x40) == 0);
    }
    if (p->pPars->fUseMux7 != 0) {
      pGVar8 = p->pGia;
      puVar11 = pGVar8->pMuxes;
      if ((puVar11 != (uint *)0x0) && (puVar11[(uint)iObj] != 0)) {
        if (pGVar8->nObjs <= iObj) goto LAB_0072a21a;
        if ((puVar11 == (uint *)0x0) || (puVar11[(uint)iObj] == 0)) {
          __assert_fail("Gia_ObjIsMux(p->pGia, pMux)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                        ,0x245,"Lf_Cut_t *Lf_MemLoadMuxCut(Lf_Man_t *, int, Lf_Cut_t *)");
        }
        Lf_ObjCutMux_CutSet._16_4_ = -(uint)(p->pPars->fCutMin == 0) | 4;
        Lf_ObjCutMux_CutSet._24_4_ = iObj - (*(uint *)(pGVar8->pObjs + (uint)iObj) & 0x1fffffff);
        Lf_ObjCutMux_CutSet._28_4_ =
             iObj - (*(uint *)&pGVar8->pObjs[(uint)iObj].field_0x4 & 0x1fffffff);
        uVar5 = puVar11[(uint)iObj];
        if (uVar5 == 0) {
          Lf_ObjCutMux_CutSet._32_4_ = 0xffffffff;
        }
        else {
          if ((int)uVar5 < 0) {
LAB_0072a0a6:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          Lf_ObjCutMux_CutSet._32_4_ = uVar5 >> 1;
        }
        Lf_ObjCutMux_CutSet._20_4_ = Lf_ObjCutMux_CutSet._20_4_ & 0x7fffff | 0x3800000;
        Lf_CutParams(p,(Lf_Cut_t *)Lf_ObjCutMux_CutSet,local_17d4,FlowRefs,pMux);
        pLVar38->Delay[2] = Lf_ObjCutMux_CutSet._8_4_;
        pLVar38->Flow[2] = (float)Lf_ObjCutMux_CutSet._12_4_;
      }
    }
    if (p->fUseEla == 0) {
LAB_00729f52:
      if ((pMux->Value != 0) && (pLVar22 = Lf_ManFetchSet(p,iObj), 0 < (int)nCutNum_00)) {
        pLVar22 = pLVar22 + 1;
        uVar25 = 0;
        do {
          uVar5 = *(uint *)&pLVar22[-1].field_0x14;
          if ((uVar5 >> 0x17 & 1) != 0) {
            __assert_fail("!pCut0->fMux7",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                          ,0x56a,"void Lf_ObjMergeOrder(Lf_Man_t *, int)");
          }
          if (uVar25 < uVar28) {
            memcpy(pLVar22 + -1,pCutsR[uVar25],lVar35 * 8);
          }
          else if (((uVar25 == uVar28) && (0x1ffffff < *(uint *)&pCutsR[0]->field_0x14)) &&
                  ((uVar28 == 1 || (0x1ffffff < *(uint *)&pCutsR[1]->field_0x14)))) {
            pLVar22[-1].iFunc = 2;
            *(uint *)&pLVar22[-1].field_0x14 = uVar5 & 0x3fffff | 0x1000000;
            *(int *)&pLVar22->Sign = iObj;
            pLVar22[-1].Sign = 1L << ((byte)iObj & 0x3f);
          }
          else {
            *(uint *)&pLVar22[-1].field_0x14 = uVar5 | 0xff000000;
          }
          uVar25 = uVar25 + 1;
          pLVar22 = (Lf_Cut_t *)(&pLVar22->Sign + lVar35);
        } while (nCutNum_00 != uVar25);
      }
      return;
    }
    *(byte *)(pLVar38->Cut + uVar25) = *(byte *)(pLVar38->Cut + uVar25) | 1;
    if (iObj < (p->vOffsets).nSize) {
      iVar48 = (p->vOffsets).pArray[(uint)iObj];
      if ((-1 < (long)iVar48) && (iVar48 < (p->vMapRefs).nSize)) {
        if (0 < (p->vMapRefs).pArray[iVar48]) {
          Lf_CutRef_rec(p,pCutsR[uVar25]);
        }
        goto LAB_00729f52;
      }
    }
  }
LAB_0072a103:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Lf_ObjMergeOrder( Lf_Man_t * p, int iObj )
{
    word CutSet[LF_CUT_MAX][LF_CUT_WORDS] = {{0}};
    Lf_Cut_t * pCutSet0, * pCutSet1, * pCutSet2, * pCut0, * pCut1, * pCut2;
    Lf_Cut_t * pCutSet = (Lf_Cut_t *)CutSet, * pCutsR[LF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Lf_Bst_t * pBest = Lf_ObjReadBest(p, iObj);
    float FlowRefs = Lf_ObjFlowRefs(p, iObj);
    int Required   = Lf_ObjRequired(p, iObj);
    int nLutSize   = p->pPars->fCutGroup ? p->pPars->nLutSize/2 : p->pPars->nLutSize;
    int nCutNum    = p->pPars->nCutNum;
    int nCutWords  = p->nCutWords;
    int fComp0     = Gia_ObjFaninC0(pObj);
    int fComp1     = Gia_ObjFaninC1(pObj);
    int nCuts0     = Lf_ManPrepareSet( p, Gia_ObjFaninId0(pObj, iObj), 0, &pCutSet0 );
    int nCuts1     = Lf_ManPrepareSet( p, Gia_ObjFaninId1(pObj, iObj), 1, &pCutSet1 );
    int iSibl      = Gia_ObjSibl(p->pGia, iObj);
    int i, k, n, iCutUsed, nCutsR = 0;
    float Value1 = -1, Value2 = -1;
    assert( !Gia_ObjIsBuf(pObj) );
    Lf_CutSetForEachCut( nCutWords, pCutSet, pCut0, i, nCutNum )
        pCutsR[i] = pCut0;
    if ( p->Iter )
    {
        assert( nCutsR == 0 );
        // load cuts
        Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[0].Handle, iObj, pCutsR[0], p->pPars->fCutMin, 1 );
        if ( Lf_BestDiffCuts(pBest) )
            Lf_MemLoadCut( &p->vStoreOld, pBest->Cut[1].Handle, iObj, pCutsR[1], p->pPars->fCutMin, 1 );
        // deref the cut
        if ( p->fUseEla && Lf_ObjMapRefNum(p, iObj) > 0 )
            Value1 = Lf_CutDeref_rec( p, pCutsR[Lf_BestIndex(pBest)] );
        // update required times
        if ( Required == ABC_INFINITY )//&& !p->fUseEla )
            Required = Lf_CutRequired( p, pCutsR[0] );
        // compute parameters
        Lf_CutParams( p, pCutsR[nCutsR++], Required, FlowRefs, pObj );
        if ( Lf_BestDiffCuts(pBest) )
        {
            assert( nCutsR == 1 );
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
        if ( pCutsR[0]->fLate )
            p->nTimeFails++;
    }
    if ( iSibl )
    {
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCutsE = Lf_ManPrepareSet( p, iSibl, 2, &pCutSet2 );
        Lf_CutSetForEachCut( nCutWords, pCutSet2, pCut2, n, nCutsE )
        {
            if ( pCut2->pLeaves[0] == iSibl )
                continue;
            Lf_CutCopy( pCutsR[nCutsR], pCut2, nCutWords );
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Lf_Cut_t * pCutSave = NULL;
        int fComp2 = Gia_ObjFaninC2(p->pGia, pObj);
        int nCuts2 = Lf_ManPrepareSet( p, Gia_ObjFaninId2(p->pGia, iObj), 2, &pCutSet2 );
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet2, pCut2, n, nCuts2 ) if ( (int)pCut2->nLeaves <= nLutSize )
        {
            pCutSave = pCut2;
            if ( Lf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Lf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Lf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
                continue;
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
        if ( p->pPars->fCutGroup )
        {
            assert( pCutSave->nLeaves == 1 );
            assert( pCutSave->pLeaves[0] == Gia_ObjFaninId2(p->pGia, iObj) );
            Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
            Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
            {
                assert( (int)pCut0->nLeaves + (int)pCut1->nLeaves + 1 <= p->pPars->nLutSize );
    //            if ( Lf_CutCountBits(pCut0->Sign | pCut1->Sign | pCutSave->Sign) > p->pPars->nLutSize )
    //                continue;
                p->CutCount[1]++; 
                if ( !Lf_CutMergeOrderMux(pCut0, pCut1, pCutSave, pCutsR[nCutsR], p->pPars->nLutSize) )
                    continue;
                if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                    continue;
                p->CutCount[2]++;
                if ( p->pPars->fCutMin && Lf_CutComputeTruthMux(p, pCut0, pCut1, pCutSave, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                    pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
    //            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
    //                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
    //                continue;
                Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
                nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
            }
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        Lf_CutSetForEachCut( nCutWords, pCutSet0, pCut0, i, nCuts0 ) if ( (int)pCut0->nLeaves <= nLutSize )
        Lf_CutSetForEachCut( nCutWords, pCutSet1, pCut1, k, nCuts1 ) if ( (int)pCut1->nLeaves <= nLutSize )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Lf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Lf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Lf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Lf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Lf_CutGetSign(pCutsR[nCutsR]);
            if ( p->pPars->nLutSizeMux && p->pPars->nLutSizeMux == (int)pCutsR[nCutsR]->nLeaves && 
                Lf_ManFindCofVar(Lf_CutTruth(p,pCutsR[nCutsR]), Abc_Truth6WordNum(nLutSize), pCutsR[nCutsR]->nLeaves) == -1 )
                continue;
            Lf_CutParams( p, pCutsR[nCutsR], Required, FlowRefs, pObj );
            nCutsR = Lf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d  Required = %2d\n", iObj, FlowRefs, Lf_ObjMapRefNum(p, iObj), Required );
        for ( i = 0; i < nCutsR; i++ )
            Lf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    }
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Lf_SetCheckArray(pCutsR, nCutsR) );
    // delay cut
    assert( nCutsR == 1 || pCutsR[0]->Delay <= pCutsR[1]->Delay );
    pBest->Cut[0].fUsed = pBest->Cut[1].fUsed = 0;
    pBest->Cut[0].Handle = pBest->Cut[1].Handle = Lf_MemSaveCut(&p->vStoreNew, pCutsR[0], iObj);
    pBest->Delay[0] = pBest->Delay[1] = pCutsR[0]->Delay;
    pBest->Flow[0] = pBest->Flow[1] = pCutsR[0]->Flow;
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
    p->nCutEqual++;
    // area cut
    iCutUsed = 0;
    if ( nCutsR > 1 && pCutsR[0]->Flow > pCutsR[1]->Flow + LF_EPSILON )//&& !pCutsR[1]->fLate ) // can remove !fLate
    {
        pBest->Cut[1].Handle = Lf_MemSaveCut(&p->vStoreNew, pCutsR[1], iObj);
        pBest->Delay[1] = pCutsR[1]->Delay;
        pBest->Flow[1] = pCutsR[1]->Flow;
        p->nCutCounts[pCutsR[1]->nLeaves]++;
        p->nCutEqual--;
        if ( !pCutsR[1]->fLate )
            iCutUsed = 1;
    }
    // mux cut
    if ( p->pPars->fUseMux7 && Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        pCut2 = Lf_ObjCutMux( p, iObj );
        Lf_CutParams( p, pCut2, Required, FlowRefs, pObj );
        pBest->Delay[2] = pCut2->Delay;
        pBest->Flow[2] = pCut2->Flow;
        // update area value of the best area cut
//        if ( !pCut2->fLate )
//            pBest->Flow[1] = Abc_MinFloat( pBest->Flow[1], pBest->Flow[2] );
    }
    // reference resulting cut
    if ( p->fUseEla )
    {
        pBest->Cut[iCutUsed].fUsed = 1;
        if ( Lf_ObjMapRefNum(p, iObj) > 0 )
            Value2 = Lf_CutRef_rec( p, pCutsR[iCutUsed] );
//        if ( Value1 < Value2 )
//            printf( "ELA degradated cost at node %d from %d to %d.\n", iObj, Value1, Value2 ), fflush(stdout);
//        assert( Value1 >= Value2 );
//        if ( Value1 != -1 )
//            printf( "%.2f -> %.2f    ", Value1, Value2 );
    }
    if ( pObj->Value == 0 )
        return;
    // store the cutset
    pCutSet = Lf_ManFetchSet(p, iObj);
    Lf_CutSetForEachCut( nCutWords, pCutSet, pCut0, i, nCutNum )
    {
        assert( !pCut0->fMux7 );
        if ( i < nCutsR )
            Lf_CutCopy( pCut0, pCutsR[i], nCutWords );
        else if ( i == nCutsR && pCutsR[0]->nLeaves > 1 && (nCutsR == 1 || pCutsR[1]->nLeaves > 1) )
            Lf_CutCreateUnit( pCut0, iObj );
        else
            pCut0->nLeaves = LF_NO_LEAF;
    }
}